

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O2

APInt * __thiscall llvm::APInt::operator=(APInt *this,APInt *RHS)

{
  APInt *pAVar1;
  
  if ((this->BitWidth < 0x41) && (RHS->BitWidth < 0x41)) {
    this->U = RHS->U;
    this->BitWidth = RHS->BitWidth;
    pAVar1 = clearUnusedBits(this);
    return pAVar1;
  }
  AssignSlowCase(this,RHS);
  return this;
}

Assistant:

APInt &operator=(const APInt &RHS) {
    // If the bitwidths are the same, we can avoid mucking with memory
    if (isSingleWord() && RHS.isSingleWord()) {
      U.VAL = RHS.U.VAL;
      BitWidth = RHS.BitWidth;
      return clearUnusedBits();
    }

    AssignSlowCase(RHS);
    return *this;
  }